

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void traverse_itree_csc<PredictionData<float,long>,long>
               (WorkerForPredictCSC *workspace,vector<IsoTree,_std::allocator<IsoTree>_> *trees,
               IsoForest *model_outputs,PredictionData<float,_long> *prediction_data,long *tree_num,
               double *per_tree_depths,size_t curr_tree,bool has_range_penalty)

{
  MissingAction missing_action;
  NewCategAction new_cat_action;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  pointer pvVar4;
  pointer pvVar5;
  size_t sVar6;
  pointer puVar7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first_00;
  byte bVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  pointer puVar12;
  unsigned_long *puVar13;
  size_type sVar14;
  IsoForest *in_RCX;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_RDX;
  WorkerForPredictCSC *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  PredictionData<float,_long> *in_R8;
  long *in_R9;
  bool bVar15;
  size_t unaff_retaddr;
  float *in_stack_00000008;
  byte in_stack_00000010;
  size_t row_5;
  size_t row_4;
  size_t end;
  size_t st;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  vector<double,_std::allocator<double>_> weights_arr;
  size_t split_ix;
  size_t end_NA;
  size_t st_NA;
  size_t orig_end;
  size_t row_3;
  size_t row_2;
  size_t row_1;
  size_t row;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb70;
  undefined4 uVar16;
  undefined4 uVar17;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffb78;
  undefined4 uVar18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffb80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffb88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffb90;
  MissingAction in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  NewCategAction in_stack_fffffffffffffba0;
  size_t *in_stack_fffffffffffffbb0;
  size_t *in_stack_fffffffffffffbb8;
  size_t *in_stack_fffffffffffffbc0;
  double in_stack_fffffffffffffc68;
  double dVar19;
  double in_stack_fffffffffffffc70;
  double dVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc78;
  IsoForest *in_stack_fffffffffffffc80;
  PredictionData<float,_long> *in_stack_fffffffffffffc88;
  WorkerForPredictCSC *in_stack_fffffffffffffc90;
  double in_stack_fffffffffffffca0;
  long *in_stack_fffffffffffffca8;
  float *in_stack_fffffffffffffcb0;
  size_t in_stack_fffffffffffffcb8;
  size_t in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcc8;
  size_t *in_stack_fffffffffffffcd0;
  long *in_stack_fffffffffffffce0;
  MissingAction in_stack_fffffffffffffce8;
  size_t *in_stack_fffffffffffffcf0;
  size_t *in_stack_fffffffffffffcf8;
  size_t *in_stack_fffffffffffffd00;
  pointer local_2b8;
  pointer local_168;
  pointer local_120;
  vector<double,_std::allocator<double>_> local_c8;
  undefined1 local_b0 [16];
  vector<double,_std::allocator<double>_> local_a0;
  unsigned_long *local_88;
  unsigned_long *local_80;
  unsigned_long *local_78;
  unsigned_long *local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 uVar21;
  undefined7 in_stack_ffffffffffffffb8;
  long *plVar22;
  PredictionData<float,_long> *pPVar23;
  IsoForest *pIVar24;
  
  bVar8 = in_stack_00000010 & 1;
  pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                     ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                      (size_type)in_stack_00000008);
  if (pvVar9->tree_left == 0) {
    if (*(int *)&in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                 super__Vector_impl_data._M_finish == 0x15) {
      for (local_58 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_58 <=
          in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; local_58 = (pointer)((long)local_58 + 1)) {
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_58);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[2].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar10);
        dVar20 = *pvVar11;
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        dVar19 = pvVar9->score;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_58);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[3].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar10);
        *pvVar11 = dVar20 * dVar19 + *pvVar11;
      }
    }
    else {
      for (puVar12 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          puVar12 <=
          in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar12 = (pointer)((long)puVar12 + 1)) {
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        dVar20 = pvVar9->score;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)puVar12);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[3].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar10);
        *pvVar11 = dVar20 + *pvVar11;
      }
    }
    if (in_R8 != (PredictionData<float,_long> *)0x0) {
      for (local_60 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_60 <=
          in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; local_60 = (pointer)((long)local_60 + 1)) {
        pPVar23 = in_R8;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_60);
        (&in_R8->numeric_data)[*pvVar10] = in_stack_00000008;
        in_R8 = pPVar23;
      }
    }
    if (in_R9 == (long *)0x0) {
      return;
    }
    for (local_68 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_68 <=
        in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; local_68 = (pointer)((long)local_68 + 1)) {
      pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                          (size_type)in_stack_00000008);
      dVar20 = pvVar9->score;
      plVar22 = in_R9;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (in_RDI,(size_type)local_68);
      in_R9[*pvVar10] = (long)dVar20;
      in_R9 = plVar22;
    }
    return;
  }
  if (((((bVar8 & 1) == 0) ||
       (*(int *)&in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                 super__Vector_impl_data._M_finish == 0x15)) || (in_stack_00000008 == (float *)0x0))
     && (pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                             (size_type)in_stack_00000008), pvVar9->col_type == Numeric)) {
    local_78 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffb68);
    local_70 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(in_stack_fffffffffffffb78._M_current,
                           (difference_type)in_stack_fffffffffffffb70);
    local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffb68);
    local_88 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(in_stack_fffffffffffffb78._M_current,
                           (difference_type)in_stack_fffffffffffffb70);
    local_80 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(in_stack_fffffffffffffb78._M_current,
                           (difference_type)in_stack_fffffffffffffb70);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  }
  local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                     ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                      (size_type)in_stack_00000008);
  if (pvVar9->col_type == Numeric) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x579762);
    uVar16 = (undefined4)((ulong)in_stack_fffffffffffffb70 >> 0x20);
    std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
              ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008);
    in_stack_fffffffffffffb68 =
         *(vector<double,_std::allocator<double>_> **)&in_RCX->has_range_penalty;
    std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
              ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008);
    in_stack_fffffffffffffb78._M_current = (unsigned_long *)&local_a0;
    in_stack_fffffffffffffb80._M_current = (unsigned_long *)(local_b0 + 8);
    in_stack_fffffffffffffb88._M_current = (double *)local_b0;
    in_stack_fffffffffffffb70 =
         (vector<double,_std::allocator<double>_> *)
         CONCAT44(uVar16,*(undefined4 *)
                          &in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                           super__Vector_impl_data._M_finish);
    divide_subset_split<float,long>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
               in_stack_fffffffffffffce0,in_stack_fffffffffffffca0,in_stack_fffffffffffffce8,
               in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00);
  }
  else if (pvVar9->col_type == Categorical) {
    iVar3 = *(int *)((long)&in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                            super__Vector_impl_data._M_start + 4);
    if (iVar3 == 0) {
      pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                          (size_type)in_stack_00000008);
      uVar18 = (undefined4)((ulong)in_stack_fffffffffffffb78._M_current >> 0x20);
      uVar17 = (undefined4)((ulong)in_stack_fffffffffffffb70 >> 0x20);
      uVar16 = (undefined4)((ulong)in_stack_fffffffffffffb68 >> 0x20);
      sVar14 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar9->cat_split);
      if (sVar14 == 0) {
        puVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x5799f1);
        pvVar4 = (in_RCX->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pvVar5 = (in_RCX->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        sVar6 = pvVar9->col_num;
        puVar12 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar7 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        missing_action =
             *(MissingAction *)
              &in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
               super__Vector_impl_data._M_finish;
        new_cat_action =
             *(NewCategAction *)
              &in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
               super__Vector_impl_data._M_start;
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        bVar15 = pvVar9->pct_tree_left <= 0.5 && pvVar9->pct_tree_left != 0.5;
        in_stack_fffffffffffffb80._M_current = (unsigned_long *)local_b0;
        in_stack_fffffffffffffb78._M_current = (unsigned_long *)(local_b0 + 8);
        in_stack_fffffffffffffb70 = &local_a0;
        in_stack_fffffffffffffb68 =
             (vector<double,_std::allocator<double>_> *)CONCAT44(uVar16,(uint)bVar15);
        divide_subset_split(puVar13,(int *)((long)&(pvVar4->
                                                  super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                           (long)pvVar5 * sVar6 * 4),(size_t)puVar12,(size_t)puVar7,
                            missing_action,new_cat_action,bVar15,(size_t *)in_stack_fffffffffffffb70
                            ,in_stack_fffffffffffffb78._M_current,
                            in_stack_fffffffffffffb80._M_current);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x579b48);
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        std::vector<signed_char,_std::allocator<signed_char>_>::data
                  ((vector<signed_char,_std::allocator<signed_char>_> *)0x579bfd);
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar9->cat_split);
        uVar1 = *(undefined4 *)
                 &in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar2 = *(undefined4 *)
                 &in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        in_stack_fffffffffffffb90._M_current = (double *)local_b0;
        in_stack_fffffffffffffb88._M_current = (double *)(local_b0 + 8);
        in_stack_fffffffffffffb80._M_current = (unsigned_long *)&local_a0;
        in_stack_fffffffffffffb70 =
             (vector<double,_std::allocator<double>_> *)CONCAT44(uVar17,uVar2);
        in_stack_fffffffffffffb68 =
             (vector<double,_std::allocator<double>_> *)CONCAT44(uVar16,uVar1);
        in_stack_fffffffffffffb78._M_current =
             (unsigned_long *)
             CONCAT44(uVar18,(uint)(pvVar9->pct_tree_left <= 0.5 && pvVar9->pct_tree_left != 0.5));
        divide_subset_split((size_t *)in_stack_fffffffffffffb88._M_current,
                            (int *)in_stack_fffffffffffffb80._M_current,
                            (size_t)in_stack_fffffffffffffb78._M_current,
                            (size_t)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,0,
                            in_stack_fffffffffffffb98,in_stack_fffffffffffffba0,false,
                            in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8,
                            in_stack_fffffffffffffbc0);
      }
    }
    else if (iVar3 == 0x29) {
      puVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x5798b0);
      pvVar4 = (in_RCX->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar5 = (in_RCX->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                          (size_type)in_stack_00000008);
      sVar6 = pvVar9->col_num;
      puVar12 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                          (size_type)in_stack_00000008);
      in_stack_fffffffffffffb68 = &local_a0;
      in_stack_fffffffffffffb70 = (vector<double,_std::allocator<double>_> *)(local_b0 + 8);
      in_stack_fffffffffffffb78._M_current = (unsigned_long *)local_b0;
      divide_subset_split(puVar13,(int *)((long)&(pvVar4->
                                                 super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                                 )._M_impl.super__Vector_impl_data._M_start +
                                         (long)pvVar5 * sVar6 * 4),(size_t)puVar12,(size_t)puVar7,
                          pvVar9->chosen_cat,
                          *(MissingAction *)
                           &in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                            super__Vector_impl_data._M_finish,(size_t *)in_stack_fffffffffffffb68,
                          (size_t *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb78._M_current);
    }
  }
  uVar21 = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  bVar15 = false;
  if ((*(int *)&in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                super__Vector_impl_data._M_start == 0) &&
     (bVar15 = false,
     *(int *)((long)&in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                     super__Vector_impl_data._M_start + 4) == 0)) {
    bVar15 = (in_RCX->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0;
  }
  if (bVar15) {
LAB_0057a180:
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x57a18d);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x57a19a);
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_b0._8_8_) {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffb68);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffb68);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffb78._M_current,(difference_type)in_stack_fffffffffffffb70);
      std::vector<double,std::allocator<double>>::
      assign<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb80._M_current,
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x57a22f);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x57a244);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::assign<unsigned_long*,void>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffb80._M_current,in_stack_fffffffffffffb78._M_current,
                 (unsigned_long *)in_stack_fffffffffffffb70);
    }
    if (((bVar8 & 1) != 0) &&
       (pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008), pvVar9->col_type == Numeric)) {
      puVar12 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start <
          local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + -1);
        in_stack_fffffffffffffc78 = in_RDI;
        pIVar24 = in_RCX;
        in_stack_fffffffffffffc88 =
             (PredictionData<float,_long> *)
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x57a34a);
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        in_stack_fffffffffffffc90 = (WorkerForPredictCSC *)pvVar9->col_num;
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        add_csc_range_penalty<PredictionData<float,long>>
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(double *)in_RCX,
                   (size_t)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                   in_stack_fffffffffffffc68);
        in_stack_fffffffffffffc80 = in_RCX;
        in_RCX = pIVar24;
      }
      if ((ulong)local_b0._8_8_ <=
          in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_b0._8_8_;
        in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar7;
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x57a44d);
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        dVar19 = (double)pvVar9->col_num;
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        dVar20 = pvVar9->range_low;
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        add_csc_range_penalty<PredictionData<float,long>>
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (double *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,dVar20,
                   dVar19);
      }
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar12;
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
    }
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_b0._8_8_) {
      if ((local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start < (ulong)local_b0._8_8_) &&
         ((in_R8 != (PredictionData<float,_long> *)0x0 || (in_R9 != (long *)0x0)))) {
        throw_unsupported_pred_error();
      }
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_b0._8_8_ + -1);
      for (local_120 = local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; local_120 < (ulong)local_b0._8_8_;
          local_120 = (pointer)((long)local_120 + 1)) {
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        dVar20 = pvVar9->pct_tree_left;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_120);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[2].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar10);
        *pvVar11 = dVar20 * *pvVar11;
      }
      pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                          (size_type)in_stack_00000008);
      in_stack_fffffffffffffb68 = (vector<double,_std::allocator<double>_> *)pvVar9->tree_left;
      traverse_itree_csc<PredictionData<float,long>,long>
                (in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                 (double *)CONCAT17(bVar8,in_stack_ffffffffffffffb8),unaff_retaddr,
                 SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
    }
    if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start <=
        local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      if ((local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start < (ulong)local_b0._8_8_) &&
         ((in_R8 != (PredictionData<float,_long> *)0x0 || (in_R9 != (long *)0x0)))) {
        throw_unsupported_pred_error();
      }
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      sVar14 = std::vector<double,_std::allocator<double>_>::size(&local_c8);
      if (sVar14 != 0) {
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffb68);
        std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffb68);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffb68);
        __first._M_current._4_4_ = in_stack_fffffffffffffb9c;
        __first._M_current._0_4_ = in_stack_fffffffffffffb98;
        std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (__first,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffb68);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffb68);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffb68);
        __first_00._M_current._4_4_ = in_stack_fffffffffffffb9c;
        __first_00._M_current._0_4_ = in_stack_fffffffffffffb98;
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  (__first_00,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffffb90._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffffb88._M_current);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x57a878);
        std::vector<double,_std::allocator<double>_>::shrink_to_fit
                  ((vector<double,_std::allocator<double>_> *)0x57a885);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x57a899);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x57a8a3);
      }
      for (local_168 = local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          uVar21 = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38),
          local_168 < (ulong)local_b0._8_8_; local_168 = (pointer)((long)local_168 + 1)) {
        pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        dVar20 = pvVar9->pct_tree_left;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,(size_type)local_168);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[2].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar10);
        *pvVar11 = (1.0 - dVar20) * *pvVar11;
      }
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008);
      traverse_itree_csc<PredictionData<float,long>,long>
                (in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                 (double *)CONCAT17(bVar8,in_stack_ffffffffffffffb8),unaff_retaddr,(bool)uVar21);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffb80._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb80._M_current);
  }
  else {
    iVar3 = *(int *)&in_RDX[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if (iVar3 != 0) {
      if (iVar3 == 0x15) goto LAB_0057a180;
      if (iVar3 != 0x16) {
        return;
      }
      pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                          (size_type)in_stack_00000008);
      if (pvVar9->pct_tree_left < 0.5) {
        local_2b8 = local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      else {
        local_2b8 = (pointer)local_b0._8_8_;
      }
      local_b0._0_8_ = local_2b8;
    }
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < (ulong)local_b0._0_8_) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_b0._0_8_ + -1);
      if (((bVar8 & 1) != 0) &&
         (pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                              (size_type)in_stack_00000008), pvVar9->col_type == Numeric)) {
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        add_csc_range_penalty<PredictionData<float,long>>
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (double *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
                   in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      }
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008);
      traverse_itree_csc<PredictionData<float,long>,long>
                (in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                 (double *)CONCAT17(bVar8,in_stack_ffffffffffffffb8),unaff_retaddr,(bool)uVar21);
    }
    if ((ulong)local_b0._0_8_ <=
        local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_b0._0_8_;
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      if (((bVar8 & 1) != 0) &&
         (pvVar9 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                              (size_type)in_stack_00000008), pvVar9->col_type == Numeric)) {
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008)
        ;
        add_csc_range_penalty<PredictionData<float,long>>
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (double *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
                   in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      }
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                ((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,(size_type)in_stack_00000008);
      traverse_itree_csc<PredictionData<float,long>,long>
                (in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                 (double *)CONCAT17(bVar8,in_stack_ffffffffffffffb8),unaff_retaddr,(bool)uVar21);
    }
  }
  return;
}

Assistant:

void traverse_itree_csc(WorkerForPredictCSC   &workspace,
                        std::vector<IsoTree>  &trees,
                        IsoForest             &model_outputs,
                        PredictionData        &prediction_data,
                        sparse_ix *restrict   tree_num,
                        double *restrict      per_tree_depths,
                        size_t                curr_tree,
                        bool                  has_range_penalty)
{
    // if (trees[curr_tree].score >= 0)
    if (unlikely(trees[curr_tree].tree_left == 0))
    {
        if (model_outputs.missing_action != Divide)
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] += trees[curr_tree].score;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] += workspace.weights_arr[workspace.ix_arr[row]] * trees[curr_tree].score;
        if (unlikely(tree_num != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                tree_num[workspace.ix_arr[row]] = curr_tree;
        if (unlikely(per_tree_depths != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                per_tree_depths[workspace.ix_arr[row]] = trees[curr_tree].score;
        return;
    }

    /* in this case, the indices are sorted in the csc penalty function */
    if (!(has_range_penalty && model_outputs.missing_action != Divide && curr_tree > 0) && trees[curr_tree].col_type == Numeric)
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    /* TODO: should mix the splitting function with the range penalty */
    
    /* divide according to tree */
    size_t orig_end = workspace.end;
    size_t st_NA, end_NA, split_ix;
    switch (trees[curr_tree].col_type)
    {
        case Numeric:
        {
            divide_subset_split(workspace.ix_arr.data(), workspace.st, workspace.end, trees[curr_tree].col_num,
                                prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                trees[curr_tree].num_split, model_outputs.missing_action,
                                st_NA, end_NA, split_ix);
            break;
        }

        case Categorical:
        {
            switch (model_outputs.cat_split_type)
            {
                case SingleCateg:
                {
                    divide_subset_split(workspace.ix_arr.data(),
                                        prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                        workspace.st, workspace.end, trees[curr_tree].chosen_cat,
                                         model_outputs.missing_action, st_NA, end_NA, split_ix);
                    break;
                }

                case SubSet:
                {
                    if (!trees[curr_tree].cat_split.size())
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end,
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            trees[curr_tree].pct_tree_left < .5, st_NA, end_NA, split_ix);
                    else
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end, trees[curr_tree].cat_split.data(),
                                            (int) trees[curr_tree].cat_split.size(),
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            (bool)(trees[curr_tree].pct_tree_left < .5), st_NA, end_NA, split_ix);
                    break;
                }
            }
            break;
        }

        default:
        {
            assert(0);
            break;
        }
    }

    /* continue splitting recursively */
    if (unlikely(model_outputs.new_cat_action == Weighted && model_outputs.cat_split_type == SubSet && prediction_data.categ_data != NULL))
        goto missing_action_divide;
    switch (model_outputs.missing_action)
    {
        case Impute:
        {
            split_ix = (trees[curr_tree].pct_tree_left >= .5)? end_NA : st_NA;
        }

        case Fail:
        {
            if (split_ix > workspace.st)
            {
                workspace.end = split_ix - 1;

                if (has_range_penalty && trees[curr_tree].col_type == Numeric)
                    add_csc_range_penalty(workspace,
                                          prediction_data,
                                          (double*)NULL,
                                          trees[curr_tree].col_num,
                                          trees[curr_tree].range_low,
                                          trees[curr_tree].range_high);

                traverse_itree_csc(workspace,
                                   trees,
                                   model_outputs,
                                   prediction_data,
                                   tree_num,
                                   per_tree_depths,
                                   trees[curr_tree].tree_left,
                                   has_range_penalty);
            }


            if (split_ix <= orig_end)
            {
                workspace.st  = split_ix;
                workspace.end = orig_end;

                if (has_range_penalty && trees[curr_tree].col_type == Numeric)
                    add_csc_range_penalty(workspace,
                                          prediction_data,
                                          (double*)NULL,
                                          trees[curr_tree].col_num,
                                          trees[curr_tree].range_low,
                                          trees[curr_tree].range_high);

                traverse_itree_csc(workspace,
                                   trees,
                                   model_outputs,
                                   prediction_data,
                                   tree_num,
                                   per_tree_depths,
                                   trees[curr_tree].tree_right,
                                   has_range_penalty);
            }
            break;
        }

        case Divide:
        {
            missing_action_divide:
            /* TODO: maybe here it shouldn't copy the whole ix_arr,
               but then it'd need to re-generate it from outside too */
            std::vector<double> weights_arr;
            std::vector<size_t> ix_arr;
            if (end_NA > workspace.st)
            {
                weights_arr.assign(workspace.weights_arr.begin(),
                                   workspace.weights_arr.begin() + end_NA);
                ix_arr.assign(workspace.ix_arr.data(),
                              workspace.ix_arr.data() + end_NA);
            }

            if (has_range_penalty && trees[curr_tree].col_type == Numeric)
            {
                size_t st = workspace.st;
                size_t end = workspace.end;

                if (workspace.st < st_NA)
                {
                    workspace.end = st_NA - 1;
                    add_csc_range_penalty(workspace,
                                          prediction_data,
                                          workspace.weights_arr.data(),
                                          trees[curr_tree].col_num,
                                          trees[curr_tree].range_low,
                                          trees[curr_tree].range_high);
                }

                if (workspace.end >= end_NA)
                {
                    workspace.st = end_NA;
                    workspace.end = end;
                    add_csc_range_penalty(workspace,
                                          prediction_data,
                                          workspace.weights_arr.data(),
                                          trees[curr_tree].col_num,
                                          trees[curr_tree].range_low,
                                          trees[curr_tree].range_high);
                }

                workspace.st = st;
                workspace.end = end;
            }

            if (end_NA > workspace.st)
            {
                if (st_NA < end_NA && (tree_num || per_tree_depths)) throw_unsupported_pred_error();
                workspace.end = end_NA - 1;
                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= trees[curr_tree].pct_tree_left;
                traverse_itree_csc(workspace,
                                   trees,
                                   model_outputs,
                                   prediction_data,
                                   tree_num,
                                   per_tree_depths,
                                   trees[curr_tree].tree_left,
                                   has_range_penalty);
            }

            if (st_NA <= orig_end)
            {
                if (st_NA < end_NA && (tree_num || per_tree_depths)) throw_unsupported_pred_error();
                workspace.st = st_NA;
                workspace.end = orig_end;
                if (weights_arr.size())
                {
                    std::copy(weights_arr.begin(),
                              weights_arr.end(),
                              workspace.weights_arr.begin());
                    std::copy(ix_arr.begin(),
                              ix_arr.end(),
                              workspace.ix_arr.begin());
                    weights_arr.clear();
                    weights_arr.shrink_to_fit();
                    ix_arr.clear();
                    ix_arr.shrink_to_fit();
                }

                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= (1. - trees[curr_tree].pct_tree_left);
                traverse_itree_csc(workspace,
                                   trees,
                                   model_outputs,
                                   prediction_data,
                                   tree_num,
                                   per_tree_depths,
                                   trees[curr_tree].tree_right,
                                   has_range_penalty);
            }
            break;
        }
    }
}